

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * LowererMD::ChangeToAssign(Instr *instr,IRType type)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  
  if ((instr->field_0x38 & 0x10) != 0) {
    BVar4 = IR::Instr::GetBailOutKind(instr);
    if (BVar4 != BailOutExpectingString) {
      bVar2 = IR::Instr::HasLazyBailOut(instr);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x360,
                           "(!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutExpectingString || instr->HasLazyBailOut())"
                           ,
                           "!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutExpectingString || instr->HasLazyBailOut()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  OVar3 = LowererMDArch::GetAssignOp(type);
  instr->m_opcode = OVar3;
  Legalize<false>(instr,false);
  return instr;
}

Assistant:

IR::Instr *
LowererMD::ChangeToAssign(IR::Instr * instr, IRType type)
{
    Assert(
        !instr->HasBailOutInfo() ||
        instr->GetBailOutKind() == IR::BailOutExpectingString ||
        instr->HasLazyBailOut()
    );

#if _M_IX86
    if (IRType_IsInt64(type))
    {
        return LowererMDArch::ChangeToAssignInt64(instr);
    }
#endif

    instr->m_opcode = LowererMDArch::GetAssignOp(type);
    Legalize(instr);

    return instr;
}